

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gostsum.c
# Opt level: O1

int hash_stream(gost_hash_ctx *ctx,int fd,char *sum)

{
  int iVar1;
  size_t length;
  long lVar2;
  uchar buffer [262144];
  undefined8 uStack_40030;
  byte abStack_40028 [262152];
  
  uStack_40030 = 0x10182a;
  start_hash(ctx);
  uStack_40030 = 0x101839;
  length = read(fd,abStack_40028,0x40000);
  while (0 < (long)length) {
    uStack_40030 = 0x10184f;
    hash_block(ctx,abStack_40028,length);
    uStack_40030 = 0x10185e;
    length = read(fd,abStack_40028,0x40000);
  }
  if ((long)length < 0) {
    iVar1 = 0;
  }
  else {
    uStack_40030 = 0x101873;
    finish_hash(ctx,abStack_40028);
    lVar2 = 0x20;
    do {
      uStack_40030 = 0x101893;
      sprintf(sum,"%02x",(ulong)abStack_40028[lVar2 + -1]);
      sum = sum + 2;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int hash_stream(gost_hash_ctx * ctx, int fd, char *sum)
{
    unsigned char buffer[BUF_SIZE];
    ssize_t bytes;
    int i;
    start_hash(ctx);
    while ((bytes = read(fd, buffer, BUF_SIZE)) > 0) {
        hash_block(ctx, buffer, bytes);
    }
    if (bytes < 0) {
        return 0;
    }
    finish_hash(ctx, buffer);
    for (i = 0; i < 32; i++) {
        sprintf(sum + 2 * i, "%02x", buffer[31 - i]);
    }
    return 1;
}